

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineOffsetCache.cpp
# Opt level: O0

uint32 __thiscall Js::LineOffsetCache::GetLineCount(LineOffsetCache *this)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> **ppRVar4;
  undefined4 *puVar5;
  ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *this_00;
  LineOffsetCache *this_local;
  
  ppRVar4 = Memory::WriteBarrierPtr::operator_cast_to_ReadOnlyList__((WriteBarrierPtr *)this);
  if (*ppRVar4 == (ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/LineOffsetCache.cpp"
                                ,0x7b,"(this->lineCharacterOffsetCacheList != nullptr)",
                                "The list was either not set from the ByteCode or not created.");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  this_00 = Memory::
            WriteBarrierPtr<JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>_>
            ::operator->(&this->lineCharacterOffsetCacheList);
  uVar3 = JsUtil::ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer>::Count(this_00);
  return uVar3;
}

Assistant:

uint32 LineOffsetCache::GetLineCount() const
    {
        AssertMsg(this->lineCharacterOffsetCacheList != nullptr, "The list was either not set from the ByteCode or not created.");
        return this->lineCharacterOffsetCacheList->Count();
    }